

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

int __thiscall
vkt::memory::anon_unknown_0::ImageCopyFromImage::verify
          (ImageCopyFromImage *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  ulong *puVar1;
  ulong uVar2;
  long lVar3;
  deUint32 dVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  deUint32 dVar7;
  PixelBufferAccess *pPVar8;
  PixelBufferAccess *extraout_RAX;
  ulong uVar9;
  int iVar10;
  int y;
  Vector<int,_4> res;
  Random rng;
  IVec4 local_78;
  deRandom local_68;
  PixelBufferAccess local_58;
  
  deRandom_init(&local_68,this->m_seed);
  uVar2 = this->m_imageMemorySize;
  if (uVar2 != 0) {
    lVar3 = *(long *)(ctx + 0x30);
    uVar9 = 0;
    do {
      puVar1 = (ulong *)(lVar3 + (uVar9 >> 6) * 8);
      *puVar1 = *puVar1 | 1L << ((byte)uVar9 & 0x3f);
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  pPVar8 = tcu::TextureLevel::getAccess(&local_58,(TextureLevel *)(ctx + 0x48));
  iVar10 = (int)pPVar8;
  if (0 < this->m_imageHeight) {
    y = 0;
    do {
      if (0 < this->m_imageWidth) {
        iVar10 = 0;
        do {
          dVar4 = deRandom_getUint32(&local_68);
          dVar5 = deRandom_getUint32(&local_68);
          dVar6 = deRandom_getUint32(&local_68);
          dVar7 = deRandom_getUint32(&local_68);
          local_78.m_data[0] = dVar4 & 0xff;
          local_78.m_data[1] = dVar5 & 0xff;
          local_78.m_data[2] = dVar6 & 0xff;
          local_78.m_data[3] = dVar7 & 0xff;
          tcu::PixelBufferAccess::setPixel(&local_58,&local_78,iVar10,y,0);
          iVar10 = iVar10 + 1;
          pPVar8 = extraout_RAX;
        } while (iVar10 < this->m_imageWidth);
      }
      iVar10 = (int)pPVar8;
      y = y + 1;
    } while (y < this->m_imageHeight);
  }
  return iVar10;
}

Assistant:

void ImageCopyFromImage::verify (VerifyContext& context, size_t)
{
	ReferenceMemory&	reference	(context.getReference());
	de::Random			rng			(m_seed);

	reference.setUndefined(0, (size_t)m_imageMemorySize);

	{
		const PixelBufferAccess&	refAccess	(context.getReferenceImage().getAccess());

		for (deInt32 y = 0; y < m_imageHeight; y++)
		for (deInt32 x = 0; x < m_imageWidth; x++)
		{
			const deUint8 r8 = rng.getUint8();
			const deUint8 g8 = rng.getUint8();
			const deUint8 b8 = rng.getUint8();
			const deUint8 a8 = rng.getUint8();

			refAccess.setPixel(UVec4(r8, g8, b8, a8), x, y);
		}
	}
}